

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batched_data_collection.cpp
# Opt level: O2

ColumnDataCollection * __thiscall
duckdb::BatchedDataCollection::Batch(BatchedDataCollection *this,idx_t batch_index)

{
  const_iterator cVar1;
  type pCVar2;
  InternalException *this_00;
  allocator local_41;
  idx_t batch_index_local;
  string local_38;
  
  batch_index_local = batch_index;
  cVar1 = ::std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>_>
          ::find(&(this->data)._M_t,&batch_index_local);
  if ((_Rb_tree_header *)cVar1._M_node != &(this->data)._M_t._M_impl.super__Rb_tree_header) {
    pCVar2 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
             ::operator*((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                          *)&cVar1._M_node[1]._M_parent);
    return pCVar2;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,
             "This batched data collection does not contain a collection for batch_index %d",
             &local_41);
  InternalException::InternalException<unsigned_long>(this_00,&local_38,batch_index_local);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

const ColumnDataCollection &BatchedDataCollection::Batch(idx_t batch_index) const {
	auto entry = data.find(batch_index);
	if (entry == data.end()) {
		throw InternalException("This batched data collection does not contain a collection for batch_index %d",
		                        batch_index);
	}
	return *entry->second;
}